

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O1

void __thiscall
glcts::ArraysOfArrays::SubroutineArgumentAliasing4<glcts::ArraysOfArrays::Interface::GL>::
test_shader_compilation
          (SubroutineArgumentAliasing4<glcts::ArraysOfArrays::Interface::GL> *this,
          TestShaderType tested_shader_type)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  int iVar1;
  long lVar2;
  long lVar3;
  long *plVar4;
  TestError *this_00;
  long *plVar5;
  long lVar6;
  string function_use;
  string iteration_loop_start;
  string iteration_loop_end;
  string verification;
  string function_definition;
  long *local_120;
  long local_110;
  long lStack_108;
  TestShaderType local_fc;
  SubroutineArgumentAliasing4<glcts::ArraysOfArrays::Interface::GL> *local_f8;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  long *local_b0 [2];
  long local_a0 [2];
  long *local_90 [2];
  long local_80 [2];
  string local_70;
  string local_50;
  
  local_90[0] = local_80;
  local_fc = tested_shader_type;
  local_f8 = this;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_90,
             "                        }\n                    }\n                }\n            }\n        }\n    }\n"
             ,"");
  local_b0[0] = local_a0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_b0,
             "    for (uint a = 0u; a < 2u; a++)\n    {\n        for (uint b = 0u; b < 2u; b++)\n        {\n            for (uint c = 0u; c < 2u; c++)\n            {\n                for (uint d = 0u; d < 2u; d++)\n                {\n                    for (uint e = 0u; e < 2u; e++)\n                    {\n                        for (uint f = 0u; f < 2u; f++)\n                        {\n"
             ,"");
  lVar6 = 0;
  do {
    lVar2 = 0x2238c78;
    if (supported_variable_types_map._16_8_ != 0) {
      lVar2 = 0x2238c78;
      lVar3 = supported_variable_types_map._16_8_;
      do {
        if ((int)test_shader_compilation::var_types_set_gl[lVar6] <= *(int *)(lVar3 + 0x20)) {
          lVar2 = lVar3;
        }
        lVar3 = *(long *)(lVar3 + 0x10 +
                         (ulong)(*(int *)(lVar3 + 0x20) <
                                (int)test_shader_compilation::var_types_set_gl[lVar6]) * 8);
      } while (lVar3 != 0);
    }
    lVar3 = 0x2238c78;
    if ((lVar2 != 0x2238c78) &&
       (lVar3 = lVar2,
       (int)test_shader_compilation::var_types_set_gl[lVar6] < *(int *)(lVar2 + 0x20))) {
      lVar3 = 0x2238c78;
    }
    if (lVar3 == 0x2238c78) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Type not found.",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0x28e8);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    local_50._M_string_length = 0;
    local_50.field_2._M_local_buf[0] = '\0';
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    local_f0._M_string_length = 0;
    local_f0.field_2._M_local_buf[0] = '\0';
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    local_70._M_string_length = 0;
    local_70.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::append((char *)&local_50);
    std::__cxx11::string::_M_append((char *)&local_50,*(ulong *)(lVar3 + 0x28));
    std::__cxx11::string::append((char *)&local_50);
    std::__cxx11::string::_M_append((char *)&local_50,*(ulong *)(lVar3 + 0x28));
    std::__cxx11::string::append((char *)&local_50);
    std::__cxx11::string::_M_append((char *)&local_50,*(ulong *)(lVar3 + 0x28));
    std::__cxx11::string::append((char *)&local_50);
    std::__cxx11::string::_M_append((char *)&local_50,*(ulong *)(lVar3 + 0x28));
    std::__cxx11::string::append((char *)&local_50);
    std::__cxx11::string::_M_append((char *)&local_50,(ulong)local_b0[0]);
    __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(lVar3 + 0x28);
    std::operator+(&local_d0,"                                   y[a][b][c][d][e][f] = ",__rhs);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_d0);
    local_120 = &local_110;
    plVar5 = plVar4 + 2;
    if ((long *)*plVar4 == plVar5) {
      local_110 = *plVar5;
      lStack_108 = plVar4[3];
    }
    else {
      local_110 = *plVar5;
      local_120 = (long *)*plVar4;
    }
    *plVar4 = (long)plVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&local_50,(ulong)local_120);
    if (local_120 != &local_110) {
      operator_delete(local_120,local_110 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::_M_append((char *)&local_50,(ulong)local_90[0]);
    std::__cxx11::string::append((char *)&local_50);
    std::__cxx11::string::_M_append((char *)&local_50,(ulong)local_b0[0]);
    std::__cxx11::string::append((char *)&local_50);
    iVar1 = std::__cxx11::string::compare((char *)__rhs);
    if (iVar1 == 0) {
      std::__cxx11::string::append((char *)&local_50);
LAB_00b83383:
      std::__cxx11::string::append((char *)&local_50);
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)__rhs);
      if (iVar1 == 0) {
        std::__cxx11::string::append((char *)&local_50);
        goto LAB_00b83383;
      }
      std::__cxx11::string::append((char *)&local_50);
      std::__cxx11::string::_M_append((char *)&local_50,*(ulong *)(lVar3 + 0x28));
    }
    std::__cxx11::string::append((char *)&local_50);
    std::__cxx11::string::_M_append((char *)&local_50,(ulong)local_90[0]);
    std::__cxx11::string::append((char *)&local_50);
    std::__cxx11::string::append((char *)&local_50);
    std::__cxx11::string::_M_append((char *)&local_50,*(ulong *)(lVar3 + 0x28));
    std::__cxx11::string::append((char *)&local_50);
    std::__cxx11::string::_M_append((char *)&local_50,*(ulong *)(lVar3 + 0x28));
    std::__cxx11::string::append((char *)&local_50);
    std::__cxx11::string::_M_append((char *)&local_50,(ulong)local_b0[0]);
    std::operator+(&local_d0,"                                   y[a][b][c][d][e][f] = ",__rhs);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_d0);
    local_120 = &local_110;
    plVar5 = plVar4 + 2;
    if ((long *)*plVar4 == plVar5) {
      local_110 = *plVar5;
      lStack_108 = plVar4[3];
    }
    else {
      local_110 = *plVar5;
      local_120 = (long *)*plVar4;
    }
    *plVar4 = (long)plVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&local_50,(ulong)local_120);
    if (local_120 != &local_110) {
      operator_delete(local_120,local_110 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::_M_append((char *)&local_50,(ulong)local_90[0]);
    std::__cxx11::string::append((char *)&local_50);
    std::__cxx11::string::_M_append((char *)&local_50,(ulong)local_b0[0]);
    std::__cxx11::string::append((char *)&local_50);
    iVar1 = std::__cxx11::string::compare((char *)__rhs);
    if (iVar1 == 0) {
      std::__cxx11::string::append((char *)&local_50);
LAB_00b83597:
      std::__cxx11::string::append((char *)&local_50);
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)__rhs);
      if (iVar1 == 0) {
        std::__cxx11::string::append((char *)&local_50);
        goto LAB_00b83597;
      }
      std::__cxx11::string::append((char *)&local_50);
      std::__cxx11::string::_M_append((char *)&local_50,*(ulong *)(lVar3 + 0x28));
    }
    std::__cxx11::string::append((char *)&local_50);
    std::__cxx11::string::_M_append((char *)&local_50,(ulong)local_90[0]);
    std::__cxx11::string::append((char *)&local_50);
    std::__cxx11::string::append((char *)&local_50);
    std::operator+(&local_d0,"    ",__rhs);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_d0);
    local_120 = &local_110;
    plVar5 = plVar4 + 2;
    if ((long *)*plVar4 == plVar5) {
      local_110 = *plVar5;
      lStack_108 = plVar4[3];
    }
    else {
      local_110 = *plVar5;
      local_120 = (long *)*plVar4;
    }
    *plVar4 = (long)plVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&local_f0,(ulong)local_120);
    if (local_120 != &local_110) {
      operator_delete(local_120,local_110 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::_M_append((char *)&local_f0,(ulong)local_b0[0]);
    std::__cxx11::string::append((char *)&local_f0);
    std::__cxx11::string::_M_append((char *)&local_f0,*(ulong *)(lVar3 + 0x28));
    std::__cxx11::string::append((char *)&local_f0);
    std::__cxx11::string::_M_append((char *)&local_f0,(ulong)local_90[0]);
    std::__cxx11::string::_M_replace((ulong)&local_70,0,(char *)local_70._M_string_length,0x1b245fd)
    ;
    if (local_fc == COMPUTE_SHADER_TYPE) {
      SubroutineFunctionCalls1<glcts::ArraysOfArrays::Interface::GL>::execute_dispatch_test
                (&local_f8->super_SubroutineFunctionCalls1<glcts::ArraysOfArrays::Interface::GL>,
                 COMPUTE_SHADER_TYPE,&local_50,&local_f0,&local_70,false,false);
      SubroutineFunctionCalls1<glcts::ArraysOfArrays::Interface::GL>::execute_dispatch_test
                (&local_f8->super_SubroutineFunctionCalls1<glcts::ArraysOfArrays::Interface::GL>,
                 local_fc,&local_50,&local_f0,&local_70,true,false);
    }
    else {
      SubroutineFunctionCalls1<glcts::ArraysOfArrays::Interface::GL>::execute_draw_test
                (&local_f8->super_SubroutineFunctionCalls1<glcts::ArraysOfArrays::Interface::GL>,
                 local_fc,&local_50,&local_f0,&local_70,false,false);
      SubroutineFunctionCalls1<glcts::ArraysOfArrays::Interface::GL>::execute_draw_test
                (&local_f8->super_SubroutineFunctionCalls1<glcts::ArraysOfArrays::Interface::GL>,
                 local_fc,&local_50,&local_f0,&local_70,true,false);
    }
    (*(local_f8->super_SubroutineFunctionCalls1<glcts::ArraysOfArrays::Interface::GL>).
      super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>.super_TestCase.super_TestNode.
      _vptr_TestNode[5])();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,
                      CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                               local_70.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,
                      CONCAT71(local_f0.field_2._M_allocated_capacity._1_7_,
                               local_f0.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,
                      CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                               local_50.field_2._M_local_buf[0]) + 1);
    }
    lVar6 = lVar6 + 1;
    if (lVar6 == 0xf) {
      if (local_b0[0] != local_a0) {
        operator_delete(local_b0[0],local_a0[0] + 1);
      }
      if (local_90[0] != local_80) {
        operator_delete(local_90[0],local_80[0] + 1);
      }
      return;
    }
  } while( true );
}

Assistant:

void SubroutineArgumentAliasing4<API>::test_shader_compilation(
	typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	static const glcts::test_var_type var_types_set_es[] = { VAR_TYPE_INT,   VAR_TYPE_FLOAT, VAR_TYPE_IVEC2,
															 VAR_TYPE_IVEC3, VAR_TYPE_IVEC4, VAR_TYPE_VEC2,
															 VAR_TYPE_VEC3,  VAR_TYPE_VEC4,  VAR_TYPE_MAT2,
															 VAR_TYPE_MAT3,  VAR_TYPE_MAT4 };
	static const size_t num_var_types_es = sizeof(var_types_set_es) / sizeof(var_types_set_es[0]);

	static const glcts::test_var_type var_types_set_gl[] = { VAR_TYPE_INT,   VAR_TYPE_FLOAT, VAR_TYPE_IVEC2,
															 VAR_TYPE_IVEC3, VAR_TYPE_IVEC4, VAR_TYPE_VEC2,
															 VAR_TYPE_VEC3,  VAR_TYPE_VEC4,  VAR_TYPE_MAT2,
															 VAR_TYPE_MAT3,  VAR_TYPE_MAT4,  VAR_TYPE_DOUBLE,
															 VAR_TYPE_DMAT2, VAR_TYPE_DMAT3, VAR_TYPE_DMAT4 };
	static const size_t num_var_types_gl = sizeof(var_types_set_gl) / sizeof(var_types_set_gl[0]);

	const std::string iteration_loop_end = "                        }\n"
										   "                    }\n"
										   "                }\n"
										   "            }\n"
										   "        }\n"
										   "    }\n";
	const std::string iteration_loop_start = "    for (uint a = 0u; a < 2u; a++)\n"
											 "    {\n"
											 "        for (uint b = 0u; b < 2u; b++)\n"
											 "        {\n"
											 "            for (uint c = 0u; c < 2u; c++)\n"
											 "            {\n"
											 "                for (uint d = 0u; d < 2u; d++)\n"
											 "                {\n"
											 "                    for (uint e = 0u; e < 2u; e++)\n"
											 "                    {\n"
											 "                        for (uint f = 0u; f < 2u; f++)\n"
											 "                        {\n";
	const glcts::test_var_type* var_types_set = var_types_set_es;
	size_t						num_var_types = num_var_types_es;
	const bool					test_compute  = (TestCaseBase<API>::COMPUTE_SHADER_TYPE == tested_shader_type);

	if (API::USE_DOUBLE)
	{
		var_types_set = var_types_set_gl;
		num_var_types = num_var_types_gl;
	}

	for (size_t var_type_index = 0; var_type_index < num_var_types; var_type_index++)
	{
		_supported_variable_types_map_const_iterator var_iterator =
			supported_variable_types_map.find(var_types_set[var_type_index]);

		if (var_iterator != supported_variable_types_map.end())
		{
			std::string function_definition;
			std::string function_use;
			std::string verification;

			function_definition += "// Subroutine types\n"
								   "subroutine bool out_routine_type(";
			function_definition += var_iterator->second.type;
			function_definition += " x[2][2][2][2][2][2], out ";
			function_definition += var_iterator->second.type;
			function_definition += " y[2][2][2][2][2][2]);\n\n"
								   "// Subroutine definitions\n"
								   "subroutine(out_routine_type) bool original_routine(";
			function_definition += var_iterator->second.type;
			function_definition += " x[2][2][2][2][2][2], out ";
			function_definition += var_iterator->second.type;
			function_definition += " y[2][2][2][2][2][2])\n{\n";
			function_definition += iteration_loop_start;
			function_definition +=
				"                                   y[a][b][c][d][e][f] = " + var_iterator->second.type + "(123);\n";
			function_definition += iteration_loop_end;
			function_definition += "\n";
			function_definition += iteration_loop_start;
			function_definition += "                                   if(x[a][b][c][d][e][f]";
			if (var_iterator->second.type == "mat4") // mat4 comparison
			{
				function_definition += "[0][0]";
				function_definition += " != float";
			}
			else if (var_iterator->second.type == "dmat4") // dmat4 comparison
			{
				function_definition += "[0][0]";
				function_definition += " != double";
			}
			else
			{
				function_definition += " != ";
				function_definition += var_iterator->second.type;
			}
			function_definition += "(((a*32u)+(b*16u)+(c*8u)+(d*4u)+(e*2u)+f))) {return false;}\n";
			function_definition += iteration_loop_end;
			function_definition += "\n    return true;\n";
			function_definition += "}\n\n"
								   "subroutine(out_routine_type) bool new_routine(";
			function_definition += var_iterator->second.type;
			function_definition += " x[2][2][2][2][2][2], out ";
			function_definition += var_iterator->second.type;
			function_definition += " y[2][2][2][2][2][2])\n{\n";
			function_definition += iteration_loop_start;
			function_definition +=
				"                                   y[a][b][c][d][e][f] = " + var_iterator->second.type + "(321);\n";
			function_definition += iteration_loop_end;
			function_definition += "\n";
			function_definition += iteration_loop_start;
			function_definition += "                                   if(x[a][b][c][d][e][f]";
			if (var_iterator->second.type == "mat4") // mat4 comparison
			{
				function_definition += "[0][0]";
				function_definition += " != float";
			}
			else if (var_iterator->second.type == "dmat4") // dmat4 comparison
			{
				function_definition += "[0][0]";
				function_definition += " != double";
			}
			else
			{
				function_definition += " != ";
				function_definition += var_iterator->second.type;
			}
			function_definition += "(((a*32u)+(b*16u)+(c*8u)+(d*4u)+(e*2u)+f))) {return false;}\n";
			function_definition += iteration_loop_end;
			function_definition += "\n    return true;\n";
			function_definition += "}\n\n"
								   "// Subroutine uniform\n"
								   "subroutine uniform out_routine_type routine;\n";

			function_use += "    " + var_iterator->second.type + " z[2][2][2][2][2][2];\n";
			function_use += iteration_loop_start;
			function_use += "                                   z[a][b][c][d][e][f] = ";
			function_use += var_iterator->second.type;
			function_use += "(((a*32u)+(b*16u)+(c*8u)+(d*4u)+(e*2u)+f));\n";
			function_use += iteration_loop_end;

			verification = "    float result = 0.0;\n"
						   "    if(routine(z, z) == true)\n"
						   "    {\n"
						   "        result = 1.0;\n"
						   "    }\n"
						   "    else\n"
						   "    {\n"
						   "        result = 0.5;\n"
						   "    }\n";

			if (false == test_compute)
			{
				this->execute_draw_test(tested_shader_type, function_definition, function_use, verification, false,
										false);
				this->execute_draw_test(tested_shader_type, function_definition, function_use, verification, true,
										false);
			}
			else
			{
				this->execute_dispatch_test(tested_shader_type, function_definition, function_use, verification, false,
											false);
				this->execute_dispatch_test(tested_shader_type, function_definition, function_use, verification, true,
											false);
			}

			/* Deallocate any resources used. */
			this->delete_objects();
		} /* if var_type iterator found */
		else
		{
			TCU_FAIL("Type not found.");
		}
	} /* for (int var_type_index = 0; ...) */
}